

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_v_predictor_8x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int local_bc;
  uint16_t *local_88;
  int i;
  __m128i above_u16;
  int bd_local;
  uint16_t *left_local;
  uint16_t *above_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 4);
  local_88 = dst;
  for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
    *(undefined8 *)local_88 = uVar1;
    *(undefined8 *)(local_88 + 4) = uVar2;
    *(undefined8 *)(local_88 + stride) = uVar1;
    *(undefined8 *)(local_88 + stride + 4) = uVar2;
    *(undefined8 *)(local_88 + stride * 2) = uVar1;
    *(undefined8 *)(local_88 + stride * 2 + 4) = uVar2;
    *(undefined8 *)(local_88 + stride * 3) = uVar1;
    *(undefined8 *)(local_88 + stride * 3 + 4) = uVar2;
    local_88 = local_88 + stride * 4;
  }
  return;
}

Assistant:

void aom_highbd_v_predictor_8x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                      const uint16_t *above,
                                      const uint16_t *left, int bd) {
  (void)left;
  (void)bd;
  const __m128i above_u16 = _mm_load_si128((const __m128i *)above);
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_store_si128((__m128i *)dst, above_u16);
    _mm_store_si128((__m128i *)(dst + stride), above_u16);
    _mm_store_si128((__m128i *)(dst + 2 * stride), above_u16);
    _mm_store_si128((__m128i *)(dst + 3 * stride), above_u16);
    dst += stride << 2;
  }
}